

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_cli.c
# Opt level: O0

int get_status(igsc_device_handle *handle)

{
  uint uVar1;
  long in_FS_OFFSET;
  uint local_30;
  uint retries;
  int ret;
  igsc_device_handle *handle_local;
  uint local_18;
  uint8_t result;
  uint uStack_14;
  uint8_t tiles_num;
  uint32_t ifr_applied;
  uint32_t supported_tests;
  
  _ifr_applied = *(long *)(in_FS_OFFSET + 0x28);
  uStack_14 = 0;
  local_18 = 0;
  handle_local._7_1_ = 0;
  handle_local._6_1_ = 0;
  local_30 = 0;
  do {
    uVar1 = igsc_ifr_get_status(handle,(long)&handle_local + 6,&stack0xffffffffffffffec,&local_18,
                                (long)&handle_local + 7);
    if (uVar1 != 0xd) break;
    gsc_msleep(2000);
    local_30 = local_30 + 1;
  } while (local_30 < 3);
  if ((uVar1 == 0) && (handle_local._6_1_ == 0)) {
    printf("Number of tiles: %u\n",(ulong)handle_local._7_1_);
    printf("Supported tests: scan_test: %u, array test: %u\n",(ulong)((uStack_14 & 1) != 0),
           (ulong)((uStack_14 & 2) != 0));
    printf("Applied repairs: DSS EN repair: %u, Array repair: %u\n",(ulong)((local_18 & 1) != 0),
           (ulong)((local_18 & 2) != 0));
    handle_local._0_4_ = 0;
  }
  else {
    if ((quiet & 1U) == 0) {
      fprintf(_stderr,"Error: Failed to get ifr status, library return code %d, command result %u\n"
              ,(ulong)uVar1,(ulong)handle_local._6_1_);
    }
    print_device_fw_status(handle);
    handle_local._0_4_ = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != _ifr_applied) {
    __stack_chk_fail();
  }
  return (int)handle_local;
}

Assistant:

mockable_static
int get_status(struct igsc_device_handle *handle)
{
    int      ret;
    uint32_t supported_tests = 0;
    uint32_t ifr_applied = 0;
    uint8_t  tiles_num = 0;
    uint8_t  result = 0;
    unsigned int retries = 0;

    /* call the igsc library routine to get the ifr status */
    while ((ret = igsc_ifr_get_status(handle, &result, &supported_tests, &ifr_applied, &tiles_num)) == IGSC_ERROR_BUSY)
    {
        gsc_msleep(CONNECT_RETRIES_SLEEP_MSEC);
        if (++retries >= MAX_CONNECT_RETRIES)
            break;
    }
    if (ret || result)
    {
        fwupd_error("Failed to get ifr status, library return code %d, command result %u\n",
                    ret, result);
        print_device_fw_status(handle);
        return EXIT_FAILURE;
    }

    printf("Number of tiles: %u\n", tiles_num);
    printf("Supported tests: scan_test: %u, array test: %u\n",
           !!(supported_tests & IGSC_IFR_SUPPORTED_TEST_SCAN),
           !!(supported_tests & IGSC_IFR_SUPPORTED_TEST_ARRAY));
    printf("Applied repairs: DSS EN repair: %u, Array repair: %u\n",
           !!(ifr_applied & IGSC_IFR_REPAIR_DSS_EN),
           !!(ifr_applied &IGSC_IFR_REPAIR_ARRAY));

    return ret;
}